

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall OStream_CZString_Test::~OStream_CZString_Test(OStream_CZString_Test *this)

{
  OStream_CZString_Test *this_local;
  
  ~OStream_CZString_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (OStream, CZString) {
    test_ostream str;

    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"de"s}), std::size_t{2}));

    str << "abcde";
    str.flush ();
}